

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall
PType::AddConversion
          (PType *this,PType *target,
          _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *convertconst)

{
  PType **ppPVar1;
  ulong uVar2;
  Conversion *pCVar3;
  ulong uVar4;
  ulong uVar5;
  Conversion local_20;
  
  uVar5 = (ulong)(this->Conversions).Count;
  pCVar3 = (this->Conversions).Array;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar5 == uVar4) {
      local_20.TargetType = target;
      local_20.ConvertConstant = convertconst;
      TArray<PType::Conversion,_PType::Conversion>::Push(&this->Conversions,&local_20);
      break;
    }
    ppPVar1 = &pCVar3->TargetType;
    pCVar3 = pCVar3 + 1;
    uVar2 = uVar4 + 1;
  } while (*ppPVar1 != target);
  return uVar5 <= uVar4;
}

Assistant:

bool PType::AddConversion(PType *target, void (*convertconst)(ZCC_ExprConstant *, class FSharedStringArena &))
{
	// Make sure a conversion hasn't already been registered
	for (unsigned i = 0; i < Conversions.Size(); ++i)
	{
		if (Conversions[i].TargetType == target)
			return false;
	}
	Conversions.Push(Conversion(target, convertconst));
	return true;
}